

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall polyscope::render::Engine::setSSAAFactor(Engine *this,int newVal)

{
  runtime_error *this_00;
  
  if (0xfffffffb < newVal - 5U) {
    this->ssaaFactor = newVal;
    (*this->_vptr_Engine[0x11])(this,1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ssaaFactor must be one of 1,2,3,4");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Engine::setSSAAFactor(int newVal) {
  if (newVal < 1 || newVal > 4) throw std::runtime_error("ssaaFactor must be one of 1,2,3,4");
  ssaaFactor = newVal;
  updateWindowSize(true);
}